

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompletionProvider.cpp
# Opt level: O1

void __thiscall
CompletionProvider::run
          (CompletionProvider *this,Id *id,
          optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          *paramsOpt)

{
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar1;
  Ch *__s;
  File *file;
  Point cursorPosition;
  CompletionList completions;
  string uri;
  CompletionList local_d8;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_b8;
  Stack<rapidjson::CrtAllocator> local_78;
  string local_40;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"Missing params for autocomplete request",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(pGVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,__s,(allocator<char> *)&local_b8);
  file = FileManager::get(&local_40);
  if (file == (File *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"!!! Null file !!!\n",0x12);
    sendNullResult(id);
    goto LAB_001838e3;
  }
  local_d8.isIncomplete = false;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (file->type == Tex) {
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)paramsOpt,"position");
    cursorPosition = getPointFromJSON(pGVar1);
    getLatexCompletionsForFileAndPoint((CompletionList *)&local_b8,file,cursorPosition);
    local_78.stack_ =
         (char *)local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.ownAllocator_ =
         (CrtAllocator *)
         local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_78.allocator_ =
         (CrtAllocator *)
         local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_d8.isIncomplete = (bool)local_b8.os_._0_1_;
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b8.level_stack_.allocator_;
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_b8.level_stack_.ownAllocator_;
    local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.level_stack_.stack_;
    local_b8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.stack_ = (char *)0x0;
    std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector
              ((vector<CompletionItem,_std::allocator<CompletionItem>_> *)&local_78);
    std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector
              ((vector<CompletionItem,_std::allocator<CompletionItem>_> *)&local_b8.level_stack_);
    if (local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_d8.items.super__Vector_base<CompletionItem,_std::allocator<CompletionItem>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001836f4;
    local_78.stack_ = (char *)0x0;
    local_78.stackTop_ = (char *)0x0;
    local_78.allocator_ = (CrtAllocator *)0x0;
    local_78.ownAllocator_ = (CrtAllocator *)0x0;
    local_78.stackEnd_ = (char *)0x0;
    local_78.initialCapacity_ = 0x100;
    local_b8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.stack_ = (char *)0x0;
    local_b8.level_stack_.stackTop_ = (char *)0x0;
    local_b8.level_stack_.stackEnd_ = (char *)0x0;
    local_b8.level_stack_.initialCapacity_ = 0x200;
    local_b8.maxDecimalPlaces_ = 0x144;
    local_b8.hasRoot_ = false;
    local_b8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_78;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"jsonrpc",7,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"2.0",3,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"id",2,false);
    Id::writeId(id,&local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,"result",6,false);
    CompletionList::reflect(&local_d8,&local_b8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_b8,0);
    sendMessage((StringBuffer *)&local_78);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_b8.level_stack_);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_78);
  }
  else {
LAB_001836f4:
    sendNullResult(id);
  }
  std::vector<CompletionItem,_std::allocator<CompletionItem>_>::~vector(&local_d8.items);
LAB_001838e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CompletionProvider::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "Missing params for autocomplete request");
        return;
    }

    Value &params = *paramsOpt;

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    CompletionList completions;

    switch (file->type) {
        case File::Type::Tex:
            completions = getLatexCompletionsForFileAndPoint(*file, getPointFromJSON(params["position"]));
            break;
        case File::Type::Bib:
            // TODO
        default:
            sendNullResult(id);
            return;
    }

    if (completions.empty()) {
        sendNullResult(id);
    } else {
        INIT_WRITER
        ADD_ID(id);
        writer.Key("result"); completions.reflect(writer);
        SEND_MESSAGE
    }
}